

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool __thiscall
duckdb::HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long>::Flush
          (HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *this)

{
  byte bVar1;
  uhugeint_t lhs;
  bool bVar2;
  ulong uVar3;
  uhugeint_t rhs;
  uhugeint_t local_28;
  
  bVar1 = this->digits;
  if ((bVar1 == 0) && (this->intermediate == 0)) {
    return true;
  }
  lhs.lower = (this->result).lower;
  lhs.upper = (this->result).upper;
  uVar3 = (this->result).lower | (this->result).upper;
  if (uVar3 != 0) {
    if (0x26 < bVar1) {
      return false;
    }
    uVar3 = *(ulong *)(Uhugeint::POWERS_OF_TEN + (ulong)bVar1 * 0x10 + 8);
    bVar2 = Uhugeint::TryMultiply
                      (lhs,*(uhugeint_t *)(Uhugeint::POWERS_OF_TEN + (ulong)bVar1 * 0x10),
                       &this->result);
    if (!bVar2) {
      return false;
    }
  }
  uhugeint_t::uhugeint_t(&local_28,this->intermediate);
  rhs.upper = uVar3;
  rhs.lower = local_28.upper;
  bVar2 = Uhugeint::TryAddInPlace((Uhugeint *)this,(uhugeint_t *)local_28.lower,rhs);
  if (!bVar2) {
    return false;
  }
  this->digits = '\0';
  this->intermediate = 0;
  return true;
}

Assistant:

bool Flush() {
		if (digits == 0 && intermediate == 0) {
			return true;
		}
		if (result.lower != 0 || result.upper != 0) {
			if (digits > 38) {
				return false;
			}
			if (!OP::TryMultiply(result, OP::POWERS_OF_TEN[digits], result)) {
				return false;
			}
		}
		if (!OP::TryAddInPlace(result, ResultType(intermediate))) {
			return false;
		}
		digits = 0;
		intermediate = 0;
		return true;
	}